

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElabVisitors.h
# Opt level: O3

void __thiscall
slang::ast::DiagnosticVisitor::handle(DiagnosticVisitor *this,InstanceSymbol *symbol)

{
  flat_hash_set<const_InstanceBodySymbol_*> *arrays_;
  group_type_pointer pgVar1;
  undefined4 uVar2;
  PortConnection *this_00;
  uint uVar3;
  undefined1 auVar4 [16];
  bool bVar5;
  ulong pos0;
  Diagnostic *pDVar6;
  DefinitionSymbol *this_01;
  value_type *elements;
  long lVar7;
  ulong hash;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  uchar uVar11;
  uchar uVar12;
  uchar uVar13;
  byte bVar14;
  undefined1 auVar15 [16];
  span<const_slang::ast::PortConnection_*const,_18446744073709551615UL> sVar16;
  string_view sVar17;
  function_ref<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  detail;
  TimeTraceScope timeScope;
  locator res;
  TimeTraceScope local_71;
  InstanceBodySymbol *local_70;
  undefined1 local_68 [16];
  bool local_58;
  ulong local_50;
  uchar local_48;
  uchar uStack_47;
  uchar uStack_46;
  byte bStack_45;
  uchar uStack_44;
  uchar uStack_43;
  uchar uStack_42;
  byte bStack_41;
  uchar uStack_40;
  uchar uStack_3f;
  uchar uStack_3e;
  byte bStack_3d;
  uchar uStack_3c;
  uchar uStack_3b;
  uchar uStack_3a;
  byte bStack_39;
  
  if (((*this->numErrors <= (ulong)this->errorLimit) && ((this->hierarchyProblem & 1U) == 0)) &&
     ((this->visitInstances != false || (((symbol->body->flags).m_bits & 2) == 0)))) {
    local_68._0_8_ = symbol;
    if (TimeTrace::profiler != 0) {
      detail.callable = (intptr_t)local_68;
      detail.callback =
           function_ref<std::__cxx11::string()>::
           callback_fn<slang::ast::DiagnosticVisitor::handle(slang::ast::InstanceSymbol_const&)::_lambda()_1_>
      ;
      sVar17._M_str = "AST Instance";
      sVar17._M_len = 0xc;
      TimeTrace::beginTrace(sVar17,detail);
    }
    sVar16 = InstanceSymbol::getPortConnections(symbol);
    if (sVar16._M_extent._M_extent_value._M_extent_value != 0) {
      lVar7 = 0;
      do {
        this_00 = *(PortConnection **)((long)sVar16._M_ptr + lVar7);
        PortConnection::getExpression(this_00);
        PortConnection::checkSimulatedNetTypes(this_00);
        lVar7 = lVar7 + 8;
      } while (sVar16._M_extent._M_extent_value._M_extent_value << 3 != lVar7);
    }
    arrays_ = &this->activeInstanceBodies;
    local_70 = symbol->body;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = local_70;
    hash = SUB168(auVar4 * ZEXT816(0x9e3779b97f4a7c15),8) ^
           SUB168(auVar4 * ZEXT816(0x9e3779b97f4a7c15),0);
    pos0 = hash >> ((byte)(this->activeInstanceBodies).table_.
                          super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::InstanceBodySymbol_*>,_slang::hash<const_slang::ast::InstanceBodySymbol_*>,_std::equal_to<const_slang::ast::InstanceBodySymbol_*>,_std::allocator<const_slang::ast::InstanceBodySymbol_*>_>
                          .arrays.groups_size_index & 0x3f);
    uVar2 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::match_word(unsigned_long)::word)[hash & 0xff];
    local_50 = (this->activeInstanceBodies).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::InstanceBodySymbol_*>,_slang::hash<const_slang::ast::InstanceBodySymbol_*>,_std::equal_to<const_slang::ast::InstanceBodySymbol_*>,_std::allocator<const_slang::ast::InstanceBodySymbol_*>_>
               .arrays.groups_size_mask;
    uVar9 = 0;
    uVar10 = pos0;
    do {
      pgVar1 = (this->activeInstanceBodies).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::InstanceBodySymbol_*>,_slang::hash<const_slang::ast::InstanceBodySymbol_*>,_std::equal_to<const_slang::ast::InstanceBodySymbol_*>,_std::allocator<const_slang::ast::InstanceBodySymbol_*>_>
               .arrays.groups_ + uVar10;
      local_48 = pgVar1->m[0].n;
      uStack_47 = pgVar1->m[1].n;
      uStack_46 = pgVar1->m[2].n;
      bStack_45 = pgVar1->m[3].n;
      uStack_44 = pgVar1->m[4].n;
      uStack_43 = pgVar1->m[5].n;
      uStack_42 = pgVar1->m[6].n;
      bStack_41 = pgVar1->m[7].n;
      uStack_40 = pgVar1->m[8].n;
      uStack_3f = pgVar1->m[9].n;
      uStack_3e = pgVar1->m[10].n;
      bStack_3d = pgVar1->m[0xb].n;
      uStack_3c = pgVar1->m[0xc].n;
      uStack_3b = pgVar1->m[0xd].n;
      uStack_3a = pgVar1->m[0xe].n;
      bStack_39 = pgVar1->m[0xf].n;
      uVar11 = (uchar)uVar2;
      auVar15[0] = -(local_48 == uVar11);
      uVar12 = (uchar)((uint)uVar2 >> 8);
      auVar15[1] = -(uStack_47 == uVar12);
      uVar13 = (uchar)((uint)uVar2 >> 0x10);
      auVar15[2] = -(uStack_46 == uVar13);
      bVar14 = (byte)((uint)uVar2 >> 0x18);
      auVar15[3] = -(bStack_45 == bVar14);
      auVar15[4] = -(uStack_44 == uVar11);
      auVar15[5] = -(uStack_43 == uVar12);
      auVar15[6] = -(uStack_42 == uVar13);
      auVar15[7] = -(bStack_41 == bVar14);
      auVar15[8] = -(uStack_40 == uVar11);
      auVar15[9] = -(uStack_3f == uVar12);
      auVar15[10] = -(uStack_3e == uVar13);
      auVar15[0xb] = -(bStack_3d == bVar14);
      auVar15[0xc] = -(uStack_3c == uVar11);
      auVar15[0xd] = -(uStack_3b == uVar12);
      auVar15[0xe] = -(uStack_3a == uVar13);
      auVar15[0xf] = -(bStack_39 == bVar14);
      for (uVar8 = (uint)(ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) |
                                  (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1 |
                                  (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                                  (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                                  (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                                  (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                                  (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                                  (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                                  (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                                  (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                                  (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                                  (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                                  (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                                  (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe); uVar8 != 0;
          uVar8 = uVar8 - 1 & uVar8) {
        uVar3 = 0;
        if (uVar8 != 0) {
          for (; (uVar8 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
          }
        }
        if (local_70 ==
            (this->activeInstanceBodies).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::InstanceBodySymbol_*>,_slang::hash<const_slang::ast::InstanceBodySymbol_*>,_std::equal_to<const_slang::ast::InstanceBodySymbol_*>,_std::allocator<const_slang::ast::InstanceBodySymbol_*>_>
            .arrays.elements_[uVar10 * 0xf + (ulong)uVar3]) {
          pDVar6 = Scope::addDiag((symbol->super_InstanceSymbolBase).super_Symbol.parentScope,
                                  (DiagCode)0x24000d,
                                  (symbol->super_InstanceSymbolBase).super_Symbol.location);
          Diagnostic::operator<<(pDVar6,(symbol->super_InstanceSymbolBase).super_Symbol.name);
          this->hierarchyProblem = true;
          goto LAB_0036d9c5;
        }
      }
      if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7] & bStack_39) == 0) break;
      lVar7 = uVar10 + uVar9;
      uVar9 = uVar9 + 1;
      uVar10 = lVar7 + 1U & local_50;
    } while (uVar9 <= local_50);
    if ((this->activeInstanceBodies).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::InstanceBodySymbol_*>,_slang::hash<const_slang::ast::InstanceBodySymbol_*>,_std::equal_to<const_slang::ast::InstanceBodySymbol_*>,_std::allocator<const_slang::ast::InstanceBodySymbol_*>_>
        .size_ctrl.size <
        (this->activeInstanceBodies).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::InstanceBodySymbol_*>,_slang::hash<const_slang::ast::InstanceBodySymbol_*>,_std::equal_to<const_slang::ast::InstanceBodySymbol_*>,_std::allocator<const_slang::ast::InstanceBodySymbol_*>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::InstanceBodySymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::InstanceBodySymbol_const*,void>,std::equal_to<slang::ast::InstanceBodySymbol_const*>,std::allocator<slang::ast::InstanceBodySymbol_const*>>
      ::nosize_unchecked_emplace_at<slang::ast::InstanceBodySymbol_const*>
                ((locator *)local_68,
                 (table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::InstanceBodySymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::InstanceBodySymbol_const*,void>,std::equal_to<slang::ast::InstanceBodySymbol_const*>,std::allocator<slang::ast::InstanceBodySymbol_const*>>
                  *)arrays_,(arrays_type *)arrays_,pos0,hash,&local_70);
      uVar10 = (this->activeInstanceBodies).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::InstanceBodySymbol_*>,_slang::hash<const_slang::ast::InstanceBodySymbol_*>,_std::equal_to<const_slang::ast::InstanceBodySymbol_*>,_std::allocator<const_slang::ast::InstanceBodySymbol_*>_>
               .size_ctrl.size + 1;
      (this->activeInstanceBodies).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::InstanceBodySymbol_*>,_slang::hash<const_slang::ast::InstanceBodySymbol_*>,_std::equal_to<const_slang::ast::InstanceBodySymbol_*>,_std::allocator<const_slang::ast::InstanceBodySymbol_*>_>
      .size_ctrl.size = uVar10;
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::InstanceBodySymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::InstanceBodySymbol_const*,void>,std::equal_to<slang::ast::InstanceBodySymbol_const*>,std::allocator<slang::ast::InstanceBodySymbol_const*>>
      ::unchecked_emplace_with_rehash<slang::ast::InstanceBodySymbol_const*>
                ((locator *)local_68,
                 (table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::InstanceBodySymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::InstanceBodySymbol_const*,void>,std::equal_to<slang::ast::InstanceBodySymbol_const*>,std::allocator<slang::ast::InstanceBodySymbol_const*>>
                  *)arrays_,hash,&local_70);
      uVar10 = (this->activeInstanceBodies).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::InstanceBodySymbol_*>,_slang::hash<const_slang::ast::InstanceBodySymbol_*>,_std::equal_to<const_slang::ast::InstanceBodySymbol_*>,_std::allocator<const_slang::ast::InstanceBodySymbol_*>_>
               .size_ctrl.size;
    }
    local_58 = true;
    local_68._0_8_ = this;
    local_68._8_8_ = symbol;
    if ((this->compilation->options).maxInstanceDepth < uVar10) {
      pDVar6 = Scope::addDiag((symbol->super_InstanceSymbolBase).super_Symbol.parentScope,
                              (DiagCode)0x25000d,
                              (symbol->super_InstanceSymbolBase).super_Symbol.location);
      this_01 = InstanceSymbol::getDefinition(symbol);
      sVar17 = DefinitionSymbol::getKindString(this_01);
      Diagnostic::operator<<(pDVar6,sVar17);
      local_70 = (InstanceBodySymbol *)(ulong)(this->compilation->options).maxInstanceDepth;
      std::
      vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
      ::emplace_back<unsigned_long>(&pDVar6->args,(unsigned_long *)&local_70);
      this->hierarchyProblem = true;
    }
    else if ((this->visitInstances == true) && (bVar5 = tryApplyFromCache(this,symbol), !bVar5)) {
      handleDefault<slang::ast::InstanceBodySymbol>(this,symbol->body);
    }
    ScopeGuard<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/ast/ElabVisitors.h:369:33)>
    ::~ScopeGuard((ScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source_ast_ElabVisitors_h:369:33)>
                   *)local_68);
LAB_0036d9c5:
    TimeTraceScope::~TimeTraceScope(&local_71);
  }
  return;
}

Assistant:

bool finishedEarly() const { return numErrors > errorLimit || hierarchyProblem; }